

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_shard.c
# Opt level: O3

REF_STATUS ref_shard_create(REF_SHARD *ref_shard_ptr,REF_GRID ref_grid)

{
  undefined1 auVar1 [16];
  uint uVar2;
  REF_SHARD pRVar3;
  REF_INT *pRVar4;
  long lVar5;
  undefined8 uVar6;
  char *pcVar7;
  int iVar9;
  undefined1 auVar8 [16];
  undefined1 auVar10 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  int iVar14;
  long lVar11;
  
  pRVar3 = (REF_SHARD)malloc(0x18);
  *ref_shard_ptr = pRVar3;
  if (pRVar3 == (REF_SHARD)0x0) {
    pcVar7 = "malloc *ref_shard_ptr of REF_SHARD_STRUCT NULL";
    uVar6 = 0x23;
  }
  else {
    pRVar3->grid = ref_grid;
    uVar2 = ref_face_create(&pRVar3->face,ref_grid);
    if (uVar2 != 0) {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_shard.c",0x2a,
             "ref_shard_create",(ulong)uVar2,"create face");
      return uVar2;
    }
    uVar2 = pRVar3->face->n;
    if ((long)(int)uVar2 < 0) {
      printf("%s: %d: %s: %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_shard.c",0x2c,
             "ref_shard_create","malloc ref_shard->mark of REF_INT negative");
      return 1;
    }
    pRVar4 = (REF_INT *)malloc((long)(int)uVar2 * 4);
    pRVar3->mark = pRVar4;
    auVar1 = _DAT_0021f120;
    if (pRVar4 != (REF_INT *)0x0) {
      if (uVar2 != 0) {
        lVar5 = (ulong)uVar2 - 1;
        auVar8._8_4_ = (int)lVar5;
        auVar8._0_8_ = lVar5;
        auVar8._12_4_ = (int)((ulong)lVar5 >> 0x20);
        lVar5 = 0;
        auVar8 = auVar8 ^ _DAT_0021f120;
        auVar10 = _DAT_00225510;
        auVar12 = _DAT_0021f110;
        do {
          auVar13 = auVar12 ^ auVar1;
          iVar9 = auVar8._4_4_;
          if ((bool)(~(auVar13._4_4_ == iVar9 && auVar8._0_4_ < auVar13._0_4_ ||
                      iVar9 < auVar13._4_4_) & 1)) {
            *(undefined4 *)((long)pRVar4 + lVar5) = 0;
          }
          if ((auVar13._12_4_ != auVar8._12_4_ || auVar13._8_4_ <= auVar8._8_4_) &&
              auVar13._12_4_ <= auVar8._12_4_) {
            *(undefined4 *)((long)pRVar4 + lVar5 + 4) = 0;
          }
          auVar13 = auVar10 ^ auVar1;
          iVar14 = auVar13._4_4_;
          if (iVar14 <= iVar9 && (iVar14 != iVar9 || auVar13._0_4_ <= auVar8._0_4_)) {
            *(undefined4 *)((long)pRVar4 + lVar5 + 8) = 0;
            *(undefined4 *)((long)pRVar4 + lVar5 + 0xc) = 0;
          }
          lVar11 = auVar12._8_8_;
          auVar12._0_8_ = auVar12._0_8_ + 4;
          auVar12._8_8_ = lVar11 + 4;
          lVar11 = auVar10._8_8_;
          auVar10._0_8_ = auVar10._0_8_ + 4;
          auVar10._8_8_ = lVar11 + 4;
          lVar5 = lVar5 + 0x10;
        } while ((ulong)(uVar2 + 3 >> 2) << 4 != lVar5);
      }
      return 0;
    }
    pcVar7 = "malloc ref_shard->mark of REF_INT NULL";
    uVar6 = 0x2c;
  }
  printf("%s: %d: %s: %s\n",
         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_shard.c",uVar6,
         "ref_shard_create",pcVar7);
  return 2;
}

Assistant:

REF_FCN REF_STATUS ref_shard_create(REF_SHARD *ref_shard_ptr,
                                    REF_GRID ref_grid) {
  REF_SHARD ref_shard;
  REF_INT face;

  ref_malloc(*ref_shard_ptr, 1, REF_SHARD_STRUCT);

  ref_shard = *ref_shard_ptr;

  ref_shard_grid(ref_shard) = ref_grid;

  RSS(ref_face_create(&(ref_shard_face(ref_shard)), ref_shard_grid(ref_shard)),
      "create face");

  ref_malloc(ref_shard->mark, ref_face_n(ref_shard_face(ref_shard)), REF_INT);

  for (face = 0; face < ref_face_n(ref_shard_face(ref_shard)); face++)
    ref_shard_mark(ref_shard, face) = 0;

  return REF_SUCCESS;
}